

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseBlanketJSCoverage::LoadCoverageData
          (cmParseBlanketJSCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  char *pcVar6;
  reference pvVar7;
  string local_3a8;
  string local_388 [32];
  undefined1 local_368 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1f0 [48];
  undefined1 local_1c0 [8];
  ostringstream cmCTestLog_msg;
  string local_48 [8];
  string path;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmParseBlanketJSCoverage *this_local;
  
  path.field_2._8_8_ = 0;
  std::__cxx11::string::string(local_48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  poVar4 = std::operator<<((ostream *)local_1c0,"Found ");
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  poVar4 = std::operator<<(poVar4," Files");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0x8e,pcVar6,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  path.field_2._8_8_ = 0;
  do {
    uVar2 = path.field_2._8_8_;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(files);
    if (sVar5 <= (ulong)uVar2) {
      this_local._7_1_ = true;
LAB_0050465d:
      std::__cxx11::string::~string(local_48);
      return this_local._7_1_;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
    poVar4 = std::operator<<((ostream *)local_368,"Reading JSON File ");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](files,path.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)pvVar7);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
                 ,0x92,pcVar6,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](files,path.field_2._8_8_);
    std::__cxx11::string::string((string *)&local_3a8,(string *)pvVar7);
    bVar3 = ReadJSONFile(this,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0050465d;
    }
    path.field_2._8_8_ = path.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

bool cmParseBlanketJSCoverage::LoadCoverageData(std::vector<std::string> files)
  {
  size_t i=0;
  std::string path;
      cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Found " << files.size() <<" Files" << std::endl, this->Coverage.Quiet);
  for(i=0;i<files.size();i++)
    {
    cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Reading JSON File " << files[i]  << std::endl, this->Coverage.Quiet);

    if(!this->ReadJSONFile(files[i]))
      {
      return false;
      }
    }
  return true;
  }